

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O0

void __thiscall phyr::ProgressReporter::endReport(ProgressReporter *this,string *p_token)

{
  __type _Var1;
  ProgressReporterException *this_00;
  char *err;
  int *in_RDI;
  ProgressReporter *in_stack_00000020;
  char *in_stack_ffffffffffffffa8;
  Timer *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if ((*in_RDI == 1) &&
     (_Var1 = std::operator==(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8), _Var1)) {
    std::unique_ptr<phyr::Timer,_std::default_delete<phyr::Timer>_>::operator->
              ((unique_ptr<phyr::Timer,_std::default_delete<phyr::Timer>_> *)0x1b4134);
    Timer::resetTimer(in_stack_ffffffffffffffb0);
    *in_RDI = 0;
    std::__cxx11::string::string((string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::operator=((string *)(in_RDI + 4),(string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    showProgress(in_stack_00000020);
    return;
  }
  if (*in_RDI == 1) {
    err = (char *)__cxa_allocate_exception(0x10);
    ProgressReporterException::ProgressReporterException
              ((ProgressReporterException *)in_stack_ffffffffffffffb0,err);
    __cxa_throw(err,&ProgressReporterException::typeinfo,
                ProgressReporterException::~ProgressReporterException);
  }
  this_00 = (ProgressReporterException *)__cxa_allocate_exception(0x10);
  ProgressReporterException::ProgressReporterException(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&ProgressReporterException::typeinfo,
              ProgressReporterException::~ProgressReporterException);
}

Assistant:

void endReport(const std::string& p_token) {
        if (state == ProgressReporterStates::ACQUIRED && token == p_token) {
            timer->resetTimer();
            state = ProgressReporterStates::AVAILABLE;
            token = std::string();

            // Last call to {showProgress()} to make sure
            // progress has been shown to 100%
            showProgress();
        } else {
            if (state != ProgressReporterStates::ACQUIRED)
                throw ProgressReporterException("Invalid ProgressReporter state");
            else
                throw ProgressReporterException("Invalid access token");
        }
    }